

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<crnlib::dxt_hc::color_cluster>::resize
          (vector<crnlib::dxt_hc::color_cluster> *this,uint new_size,bool grow_hint)

{
  undefined8 *puVar1;
  color_quad<unsigned_char,_int> *p;
  void *p_00;
  uint uVar2;
  uint uVar3;
  color_cluster *pcVar4;
  long lVar5;
  color_cluster *pcVar6;
  
  uVar2 = this->m_size;
  uVar3 = uVar2 - new_size;
  if (uVar3 != 0) {
    if (uVar2 < new_size || uVar3 == 0) {
      if (this->m_capacity < new_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,new_size,uVar2 + 1 == new_size || grow_hint,0x58,
                   object_mover,false);
        uVar2 = this->m_size;
      }
      if (new_size - uVar2 != 0) {
        pcVar4 = this->m_p;
        lVar5 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                           (pcVar4[uVar2].color_values + -6))->m_p + lVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&pcVar4[uVar2].blocks[2].m_p + lVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&pcVar4[uVar2].blocks[1].m_p + lVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&pcVar4[uVar2].blocks[0].m_p + lVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)(pcVar4[uVar2].color_values + -2) + lVar5) = 0;
          lVar5 = lVar5 + 0x58;
        } while ((ulong)(new_size - uVar2) * 0x58 - lVar5 != 0);
      }
    }
    else {
      pcVar6 = this->m_p + new_size;
      pcVar4 = pcVar6 + uVar3;
      do {
        p = (pcVar6->pixels).m_p;
        if (p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(p);
        }
        lVar5 = 0x30;
        do {
          p_00 = *(void **)((long)(pcVar6->blocks + -1) + lVar5);
          if (p_00 != (void *)0x0) {
            crnlib_free(p_00);
          }
          lVar5 = lVar5 + -0x10;
        } while (lVar5 != 0);
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != pcVar4);
    }
    this->m_size = new_size;
  }
  return;
}

Assistant:

inline void resize(uint new_size, bool grow_hint = false) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity)
          increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }
  }